

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O2

void JitFFI::SysV64::create_return(JitFuncCallerCreater *jfcc,RetData *retdata)

{
  byte bVar1;
  ArgType AVar2;
  ushort uVar3;
  uint size;
  uint rec [2];
  
  bVar1 = retdata->type;
  AVar2 = (ArgType)bVar1;
  if (bVar1 == 10) {
    return;
  }
  rec[0] = 0;
  rec[1] = 0;
  size = (uint)retdata->size;
  if (bVar1 == 2) {
    if (retdata->size == 0) {
      return;
    }
    AVar2 = ArgTypeInfo::StructTypeData::get(&retdata->std,0);
    uVar3 = 8;
    if (retdata->size < 8) {
      uVar3 = retdata->size;
    }
    create_return_base(jfcc,AVar2,(uint)uVar3,rec);
    if (retdata->size < 9) {
      return;
    }
    OpCode_x64::_add_sub_rx_byte<(unsigned_char)192>
              ((jfcc->super_JitFuncCallerCreaterX64).data,rbx,'\b');
    AVar2 = ArgTypeInfo::StructTypeData::get(&retdata->std,1);
    size = retdata->size - 8;
  }
  create_return_base(jfcc,AVar2,size,rec);
  return;
}

Assistant:

static void create_return(JitFuncCallerCreater &jfcc, const ArgTypeInfo::RetData &retdata) {
			if (retdata.type != AT_Memory) {
				unsigned int rec[2] = { 0 }; // rax/rdx, xmm0/xmm1
				if (retdata.type == AT_Struct) {
					auto &st = retdata.getstd();
					if (retdata.size > 0) {
						create_return_base(jfcc, st.get(0), std::min<unsigned>(retdata.size, 8), rec);
					}
					if (retdata.size > 8) {
						add_rx_byte(jfcc.data, rbx, 8);
						create_return_base(jfcc, st.get(1), retdata.size - 8, rec);
					}
				}
				else {
					create_return_base(jfcc, static_cast<ArgType>(retdata.type), retdata.size, rec);
				}
			}
		}